

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# physical_order.cpp
# Opt level: O0

void __thiscall
duckdb::PhysicalOrder::PhysicalOrder
          (PhysicalOrder *this,vector<duckdb::LogicalType,_true> *types,
          vector<duckdb::BoundOrderByNode,_true> *orders,vector<unsigned_long,_true> *projections,
          idx_t estimated_cardinality)

{
  idx_t in_RCX;
  vector<duckdb::BoundOrderByNode,_true> *in_RDX;
  vector<duckdb::LogicalType,_true> *in_RDI;
  vector<duckdb::BoundOrderByNode,_true> *in_stack_ffffffffffffff88;
  PhysicalOperatorType type;
  PhysicalOperator *in_stack_ffffffffffffffb0;
  undefined1 local_40 [64];
  
  type = (PhysicalOperatorType)((ulong)local_40 >> 0x38);
  vector<duckdb::LogicalType,_true>::vector
            ((vector<duckdb::LogicalType,_true> *)in_RDX,
             (vector<duckdb::LogicalType,_true> *)in_stack_ffffffffffffff88);
  PhysicalOperator::PhysicalOperator(in_stack_ffffffffffffffb0,type,in_RDI,in_RCX);
  vector<duckdb::LogicalType,_true>::~vector((vector<duckdb::LogicalType,_true> *)0x184d7d5);
  (in_RDI->super_vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>).
  super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)&PTR__PhysicalOrder_0352e328;
  vector<duckdb::BoundOrderByNode,_true>::vector(in_RDX,in_stack_ffffffffffffff88);
  vector<unsigned_long,_true>::vector
            ((vector<unsigned_long,_true> *)in_RDX,
             (vector<unsigned_long,_true> *)in_stack_ffffffffffffff88);
  return;
}

Assistant:

PhysicalOrder::PhysicalOrder(vector<LogicalType> types, vector<BoundOrderByNode> orders, vector<idx_t> projections,
                             idx_t estimated_cardinality)
    : PhysicalOperator(PhysicalOperatorType::ORDER_BY, std::move(types), estimated_cardinality),
      orders(std::move(orders)), projections(std::move(projections)) {
}